

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals Omega_h::repeat_matrix<3>(LO n,Tensor<3> m)

{
  Vector<9> v_00;
  undefined4 in_register_0000003c;
  Reals RVar1;
  Reals RVar2;
  undefined1 local_138 [72];
  double dStack_f0;
  Vector<9> v;
  LO n_local;
  double local_98 [9];
  int local_50;
  int local_4c;
  Int j;
  Int i;
  double *local_40;
  int local_34;
  double *local_30;
  int local_24;
  double *local_20;
  int local_14;
  double *local_10;
  
  RVar2.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar2.write_.shared_alloc_.alloc._0_4_ = n;
  memcpy(local_138,&m,0x48);
  memcpy(local_98,local_138,0x48);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
      i = local_4c;
      j = local_50;
      local_40 = local_98;
      local_34 = local_50;
      local_20 = local_40 + (long)local_50 * 3;
      local_24 = local_4c;
      local_14 = local_4c * 3 + local_50;
      local_10 = &dStack_f0;
      local_10[local_14] = local_20[local_4c];
      local_30 = local_40;
    }
  }
  v_00.super_Few<double,_9>.array_[1] = v.super_Few<double,_9>.array_[0];
  v_00.super_Few<double,_9>.array_[0] = dStack_f0;
  v_00.super_Few<double,_9>.array_[2] = v.super_Few<double,_9>.array_[1];
  v_00.super_Few<double,_9>.array_[3] = v.super_Few<double,_9>.array_[2];
  v_00.super_Few<double,_9>.array_[4] = v.super_Few<double,_9>.array_[3];
  v_00.super_Few<double,_9>.array_[5] = v.super_Few<double,_9>.array_[4];
  v_00.super_Few<double,_9>.array_[6] = v.super_Few<double,_9>.array_[5];
  v_00.super_Few<double,_9>.array_[7] = v.super_Few<double,_9>.array_[6];
  v_00.super_Few<double,_9>.array_[8] = v.super_Few<double,_9>.array_[7];
  RVar1 = repeat_vector<9>(n,v_00);
  RVar2.write_.shared_alloc_.direct_ptr = RVar1.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}